

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O2

void __thiscall Nes_Square::run(Nes_Square *this,nes_time_t time,nes_time_t end_time)

{
  int timer_period;
  byte bVar1;
  Blip_Buffer *pBVar2;
  Blip_Synth<12,_1> *this_00;
  uint uVar3;
  nes_time_t nVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  
  uVar8 = (uint)(this->super_Nes_Envelope).super_Nes_Osc.regs[2] |
          ((this->super_Nes_Envelope).super_Nes_Osc.regs[3] & 7) << 8;
  timer_period = uVar8 * 2 + 2;
  pBVar2 = (this->super_Nes_Envelope).super_Nes_Osc.output;
  if (pBVar2 == (Blip_Buffer *)0x0) {
    nVar4 = maintain_phase(this,time + (this->super_Nes_Envelope).super_Nes_Osc.delay,end_time,
                           timer_period);
    (this->super_Nes_Envelope).super_Nes_Osc.delay = nVar4 - end_time;
    return;
  }
  pBVar2->modified_ = 1;
  uVar3 = Nes_Envelope::volume(&this->super_Nes_Envelope);
  if (7 < uVar8 && uVar3 != 0) {
    bVar1 = (this->super_Nes_Envelope).super_Nes_Osc.regs[1];
    uVar5 = uVar8 >> (bVar1 & 7);
    if ((bVar1 & 8) != 0) {
      uVar5 = 0;
    }
    if (uVar5 + uVar8 < 0x800) {
      bVar1 = (this->super_Nes_Envelope).super_Nes_Osc.regs[0] >> 6;
      uVar8 = 2;
      if (bVar1 != 3) {
        uVar8 = 1 << bVar1;
      }
      uVar5 = 0;
      if (bVar1 == 3) {
        uVar5 = uVar3;
      }
      iVar6 = (this->super_Nes_Envelope).super_Nes_Osc.last_amp;
      uVar7 = 0;
      if (this->phase < (int)uVar8) {
        uVar7 = uVar3;
      }
      uVar7 = uVar7 ^ uVar5;
      (this->super_Nes_Envelope).super_Nes_Osc.last_amp = uVar7;
      iVar6 = uVar7 - iVar6;
      if (iVar6 != 0) {
        Blip_Synth<12,_1>::offset(this->synth,time,iVar6,pBVar2);
      }
      nVar4 = time + (this->super_Nes_Envelope).super_Nes_Osc.delay;
      if (nVar4 < end_time) {
        pBVar2 = (this->super_Nes_Envelope).super_Nes_Osc.output;
        this_00 = this->synth;
        iVar6 = uVar7 * 2 - uVar3;
        uVar5 = this->phase;
        do {
          uVar5 = uVar5 + 1 & 7;
          if ((uVar5 & ~uVar8) == 0) {
            iVar6 = -iVar6;
            Blip_Synth<12,_1>::offset_inline(this_00,nVar4,iVar6,pBVar2);
          }
          nVar4 = nVar4 + timer_period;
        } while (nVar4 < end_time);
        (this->super_Nes_Envelope).super_Nes_Osc.last_amp = (int)(iVar6 + uVar3) >> 1;
        this->phase = uVar5;
      }
      goto LAB_0062fec9;
    }
  }
  iVar6 = (this->super_Nes_Envelope).super_Nes_Osc.last_amp;
  if (iVar6 != 0) {
    Blip_Synth<12,_1>::offset(this->synth,time,-iVar6,pBVar2);
    (this->super_Nes_Envelope).super_Nes_Osc.last_amp = 0;
  }
  nVar4 = maintain_phase(this,time + (this->super_Nes_Envelope).super_Nes_Osc.delay,end_time,
                         timer_period);
LAB_0062fec9:
  (this->super_Nes_Envelope).super_Nes_Osc.delay = nVar4 - end_time;
  return;
}

Assistant:

void Nes_Square::run( nes_time_t time, nes_time_t end_time )
{
	const int period = this->period();
	const int timer_period = (period + 1) * 2;
	
	if ( !output )
	{
		delay = maintain_phase( time + delay, end_time, timer_period ) - end_time;
		return;
	}
	
	output->set_modified();
	
	int offset = period >> (regs [1] & shift_mask);
	if ( regs [1] & negate_flag )
		offset = 0;
	
	const int volume = this->volume();
	if ( volume == 0 || period < 8 || (period + offset) >= 0x800 )
	{
		if ( last_amp ) {
			synth.offset( time, -last_amp, output );
			last_amp = 0;
		}
		
		time += delay;
		time = maintain_phase( time, end_time, timer_period );
	}
	else
	{
		// handle duty select
		int duty_select = (regs [0] >> 6) & 3;
		int duty = 1 << duty_select; // 1, 2, 4, 2
		int amp = 0;
		if ( duty_select == 3 ) {
			duty = 2; // negated 25%
			amp = volume;
		}
		if ( phase < duty )
			amp ^= volume;
		
		{
			int delta = update_amp( amp );
			if ( delta )
				synth.offset( time, delta, output );
		}
		
		time += delay;
		if ( time < end_time )
		{
			Blip_Buffer* const output = this->output;
			const Synth& synth = this->synth;
			int delta = amp * 2 - volume;
			int phase = this->phase;
			
			do {
				phase = (phase + 1) & (phase_range - 1);
				if ( phase == 0 || phase == duty ) {
					delta = -delta;
					synth.offset_inline( time, delta, output );
				}
				time += timer_period;
			}
			while ( time < end_time );
			
			last_amp = (delta + volume) >> 1;
			this->phase = phase;
		}
	}
	
	delay = time - end_time;
}